

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> * __thiscall
args::Group::GetAllFlags
          (vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *__return_storage_ptr__,
          Group *this)

{
  pointer ppBVar1;
  pointer ppBVar2;
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> childRes;
  void *local_38;
  undefined8 local_30;
  
  (__return_storage_ptr__->super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppBVar1 = (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  for (ppBVar2 = (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar2 != ppBVar1; ppBVar2 = ppBVar2 + 1
      ) {
    (*(*ppBVar2)->_vptr_Base[9])(&local_38);
    std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<args::FlagBase**,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>>
              ((vector<args::FlagBase*,std::allocator<args::FlagBase*>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>)._M_impl.
               super__Vector_impl_data._M_finish,local_38,local_30);
    if (local_38 != (void *)0x0) {
      operator_delete(local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<FlagBase*> GetAllFlags() override
            {
                std::vector<FlagBase*> res;
                for (Base *child: Children())
                {
                    auto childRes = child->GetAllFlags();
                    res.insert(res.end(), childRes.begin(), childRes.end());
                }
                return res;
            }